

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O3

void ncnn::pack_A_tile(Mat *A,Mat *AT,int batch,int max_ii,int max_kk)

{
  long lVar1;
  long lVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  void **ppvVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  void **ppvVar16;
  ulong uVar17;
  int iVar18;
  undefined4 *puVar19;
  ulong uVar20;
  Mat *local_a8;
  
  if (0 < batch) {
    iVar7 = max_kk * batch;
    pvVar4 = AT->data;
    iVar3 = AT->w;
    sVar5 = AT->elemsize;
    lVar8 = (long)iVar7;
    lVar6 = (long)max_ii;
    lVar1 = lVar8 * 4;
    lVar2 = (ulong)(uint)batch * 4;
    lVar14 = 0;
    uVar17 = 0;
    local_a8 = A;
    do {
      puVar19 = (undefined4 *)((long)iVar3 * sVar5 * uVar17 + (long)pvVar4);
      if (max_ii < 8) {
        uVar20 = 0;
      }
      else {
        lVar10 = lVar14;
        uVar12 = 0;
        do {
          lVar15 = lVar10;
          iVar18 = max_kk;
          if (0 < max_kk) {
            do {
              *puVar19 = *(undefined4 *)((long)&A->data + lVar15);
              puVar19[1] = *(undefined4 *)((long)&A->data + lVar15 + lVar8 * 4);
              puVar19[2] = *(undefined4 *)((long)&A->data + lVar15 + (long)(iVar7 * 2) * 4);
              puVar19[3] = *(undefined4 *)((long)&A->data + lVar15 + (long)(iVar7 * 3) * 4);
              puVar19[4] = *(undefined4 *)((long)&A->data + lVar15 + (long)(iVar7 * 4) * 4);
              puVar19[5] = *(undefined4 *)((long)&A->data + lVar15 + (long)(iVar7 * 5) * 4);
              puVar19[6] = *(undefined4 *)((long)&A->data + lVar15 + (long)(iVar7 * 6) * 4);
              puVar19[7] = *(undefined4 *)((long)&A->data + lVar15 + (long)(iVar7 * 7) * 4);
              puVar19 = puVar19 + 8;
              iVar18 = iVar18 + -1;
              lVar15 = lVar15 + lVar2;
            } while (iVar18 != 0);
          }
          uVar20 = uVar12 + 8;
          lVar15 = uVar12 + 0xf;
          lVar10 = lVar10 + lVar8 * 0x20;
          uVar12 = uVar20;
        } while (lVar15 < lVar6);
      }
      if ((int)((uint)uVar20 | 3) < max_ii) {
        uVar11 = uVar20 & 0xffffffff;
        lVar15 = lVar1 * uVar11;
        uVar12 = uVar11;
        lVar10 = lVar14;
        do {
          lVar13 = lVar10;
          iVar18 = max_kk;
          if (0 < max_kk) {
            do {
              *puVar19 = *(undefined4 *)((long)&A->data + lVar13 + lVar15);
              puVar19[1] = *(undefined4 *)((long)&A->data + lVar13 + (uVar11 * 4 + 4) * lVar8);
              puVar19[2] = *(undefined4 *)((long)&A->data + lVar13 + lVar15 + (long)(iVar7 * 2) * 4)
              ;
              puVar19[3] = *(undefined4 *)((long)&A->data + lVar13 + lVar15 + (long)(iVar7 * 3) * 4)
              ;
              puVar19 = puVar19 + 4;
              iVar18 = iVar18 + -1;
              lVar13 = lVar13 + lVar2;
            } while (iVar18 != 0);
          }
          uVar20 = uVar12 + 4;
          lVar13 = uVar12 + 7;
          lVar10 = lVar10 + lVar8 * 0x10;
          uVar12 = uVar20;
        } while (lVar13 < lVar6);
      }
      if ((int)((uint)uVar20 | 1) < max_ii) {
        uVar12 = uVar20 & 0xffffffff;
        ppvVar9 = (void **)((long)&local_a8->data + (uVar12 * 4 + 4) * lVar8);
        ppvVar16 = (void **)((long)&local_a8->data + lVar1 * uVar12);
        do {
          if (0 < max_kk) {
            lVar10 = 0;
            iVar18 = max_kk;
            do {
              *puVar19 = *(undefined4 *)((long)ppvVar16 + lVar10);
              puVar19[1] = *(undefined4 *)((long)ppvVar9 + lVar10);
              puVar19 = puVar19 + 2;
              lVar10 = lVar10 + lVar2;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          uVar20 = uVar12 + 2;
          lVar10 = uVar12 + 3;
          ppvVar9 = ppvVar9 + lVar8;
          ppvVar16 = ppvVar16 + lVar8;
          uVar12 = uVar20;
        } while (lVar10 < lVar6);
      }
      if ((int)uVar20 < max_ii) {
        lVar10 = (long)(int)uVar20;
        ppvVar9 = (void **)((long)&local_a8->data + lVar1 * lVar10);
        do {
          ppvVar16 = ppvVar9;
          iVar18 = max_kk;
          if (0 < max_kk) {
            do {
              *puVar19 = *(undefined4 *)ppvVar16;
              puVar19 = puVar19 + 1;
              iVar18 = iVar18 + -1;
              ppvVar16 = (void **)((long)ppvVar16 + lVar2);
            } while (iVar18 != 0);
          }
          lVar10 = lVar10 + 1;
          ppvVar9 = (void **)((long)ppvVar9 + lVar1);
        } while (lVar10 != lVar6);
      }
      uVar17 = uVar17 + 1;
      lVar14 = lVar14 + 4;
      local_a8 = (Mat *)((long)&local_a8->data + 4);
    } while (uVar17 != (uint)batch);
  }
  return;
}

Assistant:

static void pack_A_tile(const Mat& A, Mat& AT, int batch, int max_ii, int max_kk)
{
    const int N = max_kk * batch;

    for (int b = 0; b < batch; b++)
    {
        float* pp = AT.row(b);

        int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; ii + 15 < max_ii; ii += 16)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                pp[4] = p0[4 * N];
                pp[5] = p0[5 * N];
                pp[6] = p0[6 * N];
                pp[7] = p0[7 * N];
                pp[8] = p0[8 * N];
                pp[9] = p0[9 * N];
                pp[10] = p0[10 * N];
                pp[11] = p0[11 * N];
                pp[12] = p0[12 * N];
                pp[13] = p0[13 * N];
                pp[14] = p0[14 * N];
                pp[15] = p0[15 * N];
                p0 += batch;
                pp += 16;
            }
        }
#endif // __AVX512F__
        for (; ii + 7 < max_ii; ii += 8)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                pp[4] = p0[4 * N];
                pp[5] = p0[5 * N];
                pp[6] = p0[6 * N];
                pp[7] = p0[7 * N];
                p0 += batch;
                pp += 8;
            }
        }
#endif // __AVX__
        for (; ii + 3 < max_ii; ii += 4)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                p0 += batch;
                pp += 4;
            }
        }
#endif // __SSE2__
        for (; ii + 1 < max_ii; ii += 2)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                p0 += batch;
                pp += 2;
            }
        }
        for (; ii < max_ii; ii++)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                p0 += batch;
                pp += 1;
            }
        }
    }
}